

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGhsMultiGenerator::GetTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalGhsMultiGenerator *this,cmGeneratorTarget *target)

{
  string *psVar1;
  cmGeneratorTarget *target_local;
  cmLocalGhsMultiGenerator *this_local;
  string *dir;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".dir");
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGhsMultiGenerator::GetTargetDirectory(
  cmGeneratorTarget const* target) const
{
  std::string dir;
  dir += target->GetName();
  dir += ".dir";
  return dir;
}